

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_vec_add32_i64_m68k(TCGContext_conflict2 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  uintptr_t o_1;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_andi_i64_m68k(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),a,-0x100000000);
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_add_i64,(TCGArg)ts_00,(TCGArg)(a + (long)tcg_ctx),
                   (TCGArg)(b + (long)tcg_ctx));
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_add_i64,(TCGArg)ts,(TCGArg)ts,(TCGArg)(b + (long)tcg_ctx));
  tcg_gen_deposit_i64_m68k
            (tcg_ctx,d,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)((long)ts_00 - (long)tcg_ctx),
             0,0x20);
  tcg_temp_free_internal_m68k(tcg_ctx,ts);
  tcg_temp_free_internal_m68k(tcg_ctx,ts_00);
  return;
}

Assistant:

void tcg_gen_vec_add32_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b)
{
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andi_i64(tcg_ctx, t1, a, ~0xffffffffull);
    tcg_gen_add_i64(tcg_ctx, t2, a, b);
    tcg_gen_add_i64(tcg_ctx, t1, t1, b);
    tcg_gen_deposit_i64(tcg_ctx, d, t1, t2, 0, 32);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}